

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O0

void PCA::power_iteration(pca_params *params,ggml_tensor *input,ggml_tensor *output)

{
  uint uVar1;
  undefined8 uVar2;
  size_type sVar3;
  reference ppgVar4;
  reference pvVar5;
  undefined8 uVar6;
  long in_RDX;
  long in_RDI;
  undefined1 unaff_retaddr;
  pca_model *in_stack_00000008;
  pca_params *in_stack_00000010;
  ggml_tensor *in_stack_00000028;
  pca_model *in_stack_00000030;
  size_t k;
  ggml_cgraph *gf;
  pca_result *in_stack_00000050;
  bool calc_square;
  int iter;
  int n_iters;
  ggml_tensor *last_eigenvector;
  pca_result result;
  ggml_gallocr_t allocr;
  pca_model model;
  pca_result *in_stack_ffffffffffffff00;
  ulong local_c8;
  int local_b0;
  value_type local_a8;
  long local_a0;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> vStack_98;
  vector<float,_std::allocator<float>_> vStack_80;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  pca_model::pca_model(in_stack_00000030,in_stack_00000028);
  uVar2 = ggml_backend_get_default_buffer_type(local_50);
  local_58 = ggml_gallocr_new(uVar2);
  pca_result::pca_result(in_stack_ffffffffffffff00);
  local_a8 = (value_type)0x0;
  uVar1 = *(int *)(local_8 + 8) / *(int *)(local_8 + 4);
  local_b0 = 0;
  do {
    if ((int)uVar1 <= local_b0) {
      if (local_a8 == (value_type)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
                   ,0x11f,"GGML_ASSERT(%s) failed","last_eigenvector");
      }
      uVar2 = *(undefined8 *)(local_18 + 0xf8);
      uVar6 = ggml_nbytes();
      ggml_backend_tensor_get(local_a8,uVar2,0,uVar6);
      ggml_gallocr_free(local_58);
      pca_result::~pca_result((pca_result *)local_a8);
      pca_model::~pca_model((pca_model *)local_a8);
      return;
    }
    build_graph_piter(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
    compute_piter((pca_params *)
                  result.eigenvectors.
                  super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(pca_model *)result.calculated_square,
                  (ggml_cgraph *)last_eigenvector,_iter,in_stack_00000050);
    for (local_c8 = 0; sVar3 = std::vector<float,_std::allocator<float>_>::size(&vStack_80),
        local_c8 < sVar3; local_c8 = local_c8 + 1) {
      ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                          (&vStack_98,local_c8);
      local_a8 = *ppgVar4;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&vStack_80,local_c8);
      if (*pvVar5 < *(float *)(local_8 + 0xc)) break;
    }
    if (local_b0 == 0) {
      if (local_a0 == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
                   ,0x110,"GGML_ASSERT(%s) failed","result.calculated_square != NULL");
      }
      ggml_backend_tensor_copy(local_a0,local_28);
    }
    if (local_a8 == (value_type)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
                 ,0x116,"GGML_ASSERT(%s) failed","last_eigenvector != NULL");
    }
    ggml_backend_tensor_copy(local_a8,local_20);
    printf("%s: layer %d/%d, iteration: %d / total: %d (batch = %d) ...\n","power_iteration",
           (ulong)(*(int *)(local_8 + 0x10) + 1),(ulong)*(uint *)(local_8 + 0x14),
           (ulong)(local_b0 + 1),(ulong)uVar1,*(undefined4 *)(local_8 + 4));
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

static void power_iteration(
        const struct pca_params & params,
        struct ggml_tensor * input, // shape of input: [n_samples, n_embd]
        struct ggml_tensor * output) {
    //printf("in power iteration\n");
    struct pca_model model(input);

    ggml_gallocr_t allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(model.backend));
    struct pca_result result;
    struct ggml_tensor * last_eigenvector = NULL;

    int n_iters = params.n_iterations / params.n_batch; // more batch, fewer iterations
    for (int iter = 0; iter < n_iters; ++iter) {
        bool calc_square = (iter == 0); // only need to calculate square for first iteration
        struct ggml_cgraph * gf = build_graph_piter(params, model, calc_square);
        // ggml_graph_dump_dot(gf, nullptr, "/tmp/_cgraph.dot");
        compute_piter(params, model, gf, allocr, result);

        for (size_t k = 0; k < result.distances.size(); ++k) {
            last_eigenvector = result.eigenvectors[k];
            if (result.distances[k] < params.tolerance) {
                break; // done
            }
        }

        if (calc_square) {
            // copy and store the square matrix if needed
            GGML_ASSERT(result.calculated_square != NULL);
            ggml_backend_tensor_copy(result.calculated_square, model.dev_square);
        }

        {
            // copy last eigen vector and store as input for next iteration
            GGML_ASSERT(last_eigenvector != NULL);
            ggml_backend_tensor_copy(last_eigenvector, model.dev_eigenvector);
        }

        printf("%s: layer %d/%d, iteration: %d / total: %d (batch = %d) ...\n",
            __func__, params.i_layer+1, params.n_layers, iter+1, n_iters, params.n_batch);
    }

    // get output tensor
    GGML_ASSERT(last_eigenvector);
    ggml_backend_tensor_get(last_eigenvector, output->data, 0, ggml_nbytes(last_eigenvector));
    //print_debug_tensor(output);
    ggml_gallocr_free(allocr);

    // TODO @ngxson : The output vector is randomly inverted
    // Solution: https://github.com/ggerganov/llama.cpp/pull/8069#issuecomment-2185328171
}